

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::GridDataType2::operator==(GridDataType2 *this,GridDataType2 *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = GridData::operator!=(&this->super_GridData,&Value->super_GridData);
  if ((KVar1) ||
     (*(short *)&(this->super_GridData).field_0xc != *(short *)&(Value->super_GridData).field_0xc))
  {
    bVar2 = false;
  }
  else {
    bVar2 = std::operator!=(&this->m_vf32Values,&Value->m_vf32Values);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

KBOOL GridDataType2::operator == ( const GridDataType2 & Value ) const
{
    if( GridData::operator != ( Value ) )           return false;
    if( m_ui16NumValues  != Value.m_ui16NumValues ) return false;
    if( m_vf32Values     != Value.m_vf32Values )    return false;
    return true;
}